

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

fy_eventp * fy_parse_empty_scalar(fy_parser *fyp)

{
  fy_event *fye;
  fy_eventp *fyep;
  fy_parser *fyp_local;
  
  fyp_local = (fy_parser *)fy_parse_eventp_alloc(fyp);
  if (fyp_local == (fy_parser *)0x0) {
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x1003,"fy_parse_empty_scalar","fy_eventp_alloc() failed!");
    fyp_local = (fy_parser *)0x0;
  }
  else {
    ((fy_event *)&(fyp_local->cfg).diag)->type = FYET_SCALAR;
    (((anon_union_32_10_0c739a1b_for_fy_event_1 *)&fyp_local->queued_inputs)->document_start).
    document_start = (fy_token *)0x0;
    (((anon_union_32_10_0c739a1b_for_fy_event_1 *)&fyp_local->queued_inputs)->document_start).
    document_state = (fy_document_state *)0x0;
    fyp_local->current_input = (fy_input *)0x0;
  }
  return (fy_eventp *)fyp_local;
}

Assistant:

static struct fy_eventp *
fy_parse_empty_scalar(struct fy_parser *fyp) {
    struct fy_eventp *fyep;
    struct fy_event *fye;

    fyep = fy_parse_eventp_alloc(fyp);
    fyp_error_check(fyp, fyep, err_out,
                    "fy_eventp_alloc() failed!");
    fye = &fyep->e;

    fye->type = FYET_SCALAR;
    fye->scalar.anchor = NULL;
    fye->scalar.tag = NULL;
    fye->scalar.value = NULL;
    return fyep;
    err_out:
    return NULL;
}